

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_long,unsigned_long(*&)(unsigned_long,unsigned_long)>
          (Memory *this,u64 offset,u64 addend,unsigned_long rhs,
          BinopFunc<unsigned_long,_unsigned_long> **func,unsigned_long *out)

{
  ulong uVar1;
  pointer puVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  Enum EVar6;
  
  puVar2 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
  EVar6 = Error;
  if ((((7 < uVar5) && (offset <= uVar5)) && (addend <= uVar5)) &&
     ((uVar1 = addend + offset, (uVar1 & 7) == 0 && (uVar1 + 8 <= uVar5)))) {
    uVar3 = *(unsigned_long *)(puVar2 + uVar1);
    uVar4 = (**func)(uVar3,rhs);
    puVar2 = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar5 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
    if (((uVar1 + 8 <= uVar5) && ((7 < uVar5 && (offset <= uVar5)))) && (addend <= uVar5)) {
      *(unsigned_long *)(puVar2 + uVar1) = uVar4;
      *out = uVar3;
      EVar6 = Ok;
    }
  }
  return (Result)EVar6;
}

Assistant:

Result Memory::AtomicRmw(u64 offset, u64 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}